

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O1

void asmjit::v1_14::BaseEmitter_updateForcedOptions(BaseEmitter *self)

{
  DiagnosticOptions DVar1;
  bool bVar2;
  
  if (self->_emitterType == kAssembler) {
    DVar1 = kValidateAssembler;
    if (self->_code == (CodeHolder *)0x0) {
      bVar2 = false;
    }
    else {
      bVar2 = self->_logger != (Logger *)0x0;
    }
  }
  else {
    bVar2 = self->_code != (CodeHolder *)0x0;
    DVar1 = kValidateIntermediate;
  }
  self->_emitterFlags = bVar2 << 3 | self->_emitterFlags & ~kLogComments;
  if (((self->_code != (CodeHolder *)0x0) && ((self->_diagnosticOptions & DVar1) == kNone)) &&
     (self->_logger == (Logger *)0x0)) {
    *(undefined1 *)&self->_forcedInstOptions = (char)self->_forcedInstOptions & 0xfe;
    return;
  }
  *(undefined1 *)&self->_forcedInstOptions = (char)self->_forcedInstOptions | kReserved;
  return;
}

Assistant:

static ASMJIT_NOINLINE void BaseEmitter_updateForcedOptions(BaseEmitter* self) noexcept {
  bool emitComments = false;
  bool hasDiagnosticOptions = false;

  if (self->emitterType() == EmitterType::kAssembler) {
    // Assembler: Don't emit comments if logger is not attached.
    emitComments = self->_code != nullptr && self->_logger != nullptr;
    hasDiagnosticOptions = self->hasDiagnosticOption(DiagnosticOptions::kValidateAssembler);
  }
  else {
    // Builder/Compiler: Always emit comments, we cannot assume they won't be used.
    emitComments = self->_code != nullptr;
    hasDiagnosticOptions = self->hasDiagnosticOption(DiagnosticOptions::kValidateIntermediate);
  }

  if (emitComments)
    self->_addEmitterFlags(EmitterFlags::kLogComments);
  else
    self->_clearEmitterFlags(EmitterFlags::kLogComments);

  // The reserved option tells emitter (Assembler/Builder/Compiler) that there may be either a border
  // case (CodeHolder not attached, for example) or that logging or validation is required.
  if (self->_code == nullptr || self->_logger || hasDiagnosticOptions)
    self->_forcedInstOptions |= InstOptions::kReserved;
  else
    self->_forcedInstOptions &= ~InstOptions::kReserved;
}